

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode parseurl(char *url,CURLU *u,uint flags)

{
  byte bVar1;
  _Bool _Var2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  CURLUcode CVar7;
  CURLUcode CVar8;
  CURLcode CVar9;
  size_t sVar10;
  byte *pbVar11;
  size_t sVar12;
  char *pcVar13;
  Curl_handler *pCVar14;
  long lVar15;
  uint uVar16;
  char *pcVar17;
  char *pcVar18;
  char **optionsp;
  byte *pbVar19;
  ulong uVar20;
  byte *pbVar21;
  char endbracket;
  uint local_64;
  int len;
  char *passwdp;
  char *userp;
  byte *local_48;
  char schemebuf [8];
  
  sVar10 = strlen(url);
  pbVar11 = (byte *)(*Curl_cmalloc)(sVar10 * 2 + 2);
  u->scratch = (char *)pbVar11;
  CVar8 = CURLUE_OUT_OF_MEMORY;
  if (pbVar11 == (byte *)0x0) goto LAB_003d00e8;
  pbVar11[sVar10 + 1] = 0;
  _Var2 = Curl_is_absolute_url(url,schemebuf,8);
  CVar8 = CURLUE_MALFORMED_INPUT;
  if (_Var2) {
    local_64 = flags;
    sVar12 = strlen(schemebuf);
    iVar4 = Curl_strcasecompare(schemebuf,"file");
    if (iVar4 == 0) {
      *pbVar11 = 0;
      url = url + sVar12;
      uVar5 = 0xfffffffb;
      do {
        pcVar13 = url + 1;
        url = url + 1;
        uVar16 = uVar5 + 1;
        if (*pcVar13 != '/') break;
        uVar6 = uVar5 + 5;
        uVar5 = uVar16;
      } while (uVar6 < 4);
      if (0xfffffffc < uVar16) {
        pcVar13 = schemebuf;
        pCVar14 = Curl_builtin_scheme(pcVar13);
        if ((local_64 & 8) == 0 && pCVar14 == (Curl_handler *)0x0) {
          CVar8 = CURLUE_UNSUPPORTED_SCHEME;
          goto LAB_003d00e8;
        }
        CVar7 = junkscan(pcVar13);
        CVar8 = CURLUE_MALFORMED_INPUT;
        if (CVar7 != CURLUE_OK) goto LAB_003d00e8;
        goto LAB_003cfae3;
      }
LAB_003cfda3:
      CVar8 = CURLUE_MALFORMED_INPUT;
      goto LAB_003d00e8;
    }
    strcpy((char *)pbVar11,url + 5);
    pcVar13 = (*Curl_cstrdup)("file");
    u->scheme = pcVar13;
    if (pcVar13 == (char *)0x0) goto LAB_003d00e5;
    bVar3 = *pbVar11;
    pbVar21 = pbVar11;
    if (bVar3 == 0x2f) {
      if (pbVar11[1] == 0x2f) {
        pbVar21 = pbVar11 + 2;
        bVar3 = pbVar11[2];
        if (bVar3 != 0x2f) {
          if (((0x19 < (byte)((bVar3 & 0xdf) + 0xbf)) ||
              ((pbVar11[3] != 0x7c && (pbVar11[3] != 0x3a)))) ||
             ((bVar1 = pbVar11[4], bVar1 != 0 && ((bVar1 != 0x2f && (bVar1 != 0x5c)))))) {
            iVar4 = curl_strnequal("localhost/",(char *)pbVar21,10);
            if ((iVar4 == 0) &&
               (iVar4 = curl_strnequal("127.0.0.1/",(char *)pbVar21,10), iVar4 == 0))
            goto LAB_003cfda3;
            bVar3 = pbVar11[0xb];
            pbVar21 = pbVar11 + 0xb;
            if (bVar3 == 0x2f) goto LAB_003cfc68;
          }
          goto LAB_003cfc8e;
        }
      }
LAB_003cfc68:
      if (((byte)((pbVar21[1] & 0xdf) + 0xbf) < 0x1a) &&
         ((pbVar21[2] == 0x7c || (pbVar21[2] == 0x3a)))) {
        bVar3 = pbVar21[3];
LAB_003cfcae:
        CVar8 = CURLUE_MALFORMED_INPUT;
        if (((bVar3 == 0) || (bVar3 == 0x2f)) || (bVar3 == 0x5c)) goto LAB_003d00e8;
      }
    }
    else {
LAB_003cfc8e:
      if (((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a) && ((pbVar21[1] == 0x7c || (pbVar21[1] == 0x3a))))
      {
        bVar3 = pbVar21[2];
        goto LAB_003cfcae;
      }
    }
    pbVar19 = (byte *)0x0;
    pbVar11 = pbVar21;
LAB_003cfd8c:
    pCVar14 = Curl_builtin_scheme(u->scheme);
    CVar8 = junkscan((char *)pbVar11);
    if (CVar8 != CURLUE_OK) goto LAB_003cfda3;
    local_48 = pbVar19;
    pcVar13 = strchr((char *)pbVar11,0x3f);
    if (pcVar13 == (char *)0x0) {
      pbVar19 = (byte *)0x0;
    }
    else {
      pbVar19 = (byte *)(pcVar13 + 1);
      *pcVar13 = '\0';
    }
    pbVar21 = pbVar19;
    if (pbVar19 == (byte *)0x0) {
      pbVar21 = pbVar11;
    }
    pcVar13 = strchr((char *)pbVar21,0x23);
    if (pcVar13 == (char *)0x0) {
      pcVar17 = (char *)0x0;
    }
    else {
      pcVar17 = pcVar13 + 1;
      *pcVar13 = '\0';
    }
    if (*pbVar11 != 0) {
      if ((local_64 & 0x10) == 0) {
        pcVar13 = Curl_dedotdotify((char *)pbVar11);
        if (pcVar13 == (char *)0x0) goto LAB_003d00e5;
        iVar4 = strcmp(pcVar13,(char *)pbVar11);
        if (iVar4 != 0) {
          u->path = pcVar13;
          goto LAB_003cfe53;
        }
        (*Curl_cfree)(pcVar13);
      }
      pcVar13 = (*Curl_cstrdup)((char *)pbVar11);
      u->path = pcVar13;
      if (pcVar13 == (char *)0x0) goto LAB_003d00e5;
    }
LAB_003cfe53:
    pbVar11 = local_48;
    if (local_48 != (byte *)0x0) {
      CVar8 = junkscan((char *)local_48);
      if (CVar8 != CURLUE_OK) goto LAB_003cfda3;
      userp = (char *)0x0;
      passwdp = (char *)0x0;
      _len = (char *)0x0;
      pcVar13 = strchr((char *)pbVar11,0x40);
      if (pcVar13 == (char *)0x0) {
        CVar8 = CURLUE_OK;
        pcVar18 = (char *)0x0;
LAB_003cfee9:
        (*Curl_cfree)(pcVar18);
        (*Curl_cfree)(passwdp);
        (*Curl_cfree)(_len);
        if (pcVar13 != (char *)0x0) goto LAB_003d00e8;
      }
      else {
        uVar20 = ~(ulong)pbVar11;
        if ((pCVar14 == (Curl_handler *)0x0) || ((pCVar14->flags & 0x400) == 0)) {
          optionsp = (char **)0x0;
        }
        else {
          optionsp = (char **)&len;
        }
        pbVar11 = (byte *)(pcVar13 + 1);
        CVar9 = Curl_parse_login_details
                          ((char *)local_48,(size_t)(pcVar13 + uVar20 + 1),&userp,&passwdp,optionsp)
        ;
        pcVar18 = userp;
        if (CVar9 != CURLE_OK) {
          CVar8 = CURLUE_MALFORMED_INPUT;
          goto LAB_003cfee9;
        }
        if (userp != (char *)0x0) {
          if ((local_64 & 0x20) != 0) {
            CVar8 = CURLUE_USER_NOT_ALLOWED;
            goto LAB_003cfee9;
          }
          u->user = userp;
        }
        if (passwdp != (char *)0x0) {
          u->password = passwdp;
        }
        if (_len != (char *)0x0) {
          u->options = _len;
        }
      }
      iVar4 = __isoc99_sscanf(pbVar11,"[%*45[0123456789abcdefABCDEF:.%%]%c%n",&endbracket,&len);
      if ((iVar4 == 1) && (endbracket == ']')) {
        if (pbVar11[len] != 0x3a) goto LAB_003cfda3;
        pbVar21 = pbVar11 + len;
LAB_003cff97:
        iVar4 = Curl_isdigit((uint)pbVar21[1]);
        CVar8 = CURLUE_BAD_PORT_NUMBER;
        if (iVar4 == 0) goto LAB_003d00e8;
        lVar15 = strtol((char *)(pbVar21 + 1),&userp,10);
        if ((lVar15 - 0x10000U < 0xffffffffffff0001) || (*userp != '\0')) goto LAB_003d00e8;
        *pbVar21 = 0;
        if ((byte *)userp != pbVar21 + 1) {
          *userp = '\0';
          curl_msnprintf((char *)&passwdp,7,"%ld",lVar15);
          u->portnum = lVar15;
          pcVar13 = (*Curl_cstrdup)((char *)&passwdp);
          u->port = pcVar13;
          if (pcVar13 == (char *)0x0) {
            CVar8 = CURLUE_OUT_OF_MEMORY;
            goto LAB_003d00e8;
          }
        }
      }
      else {
        pbVar21 = (byte *)strchr((char *)pbVar11,0x3a);
        if (pbVar21 != (byte *)0x0) goto LAB_003cff97;
      }
      sVar10 = strlen((char *)pbVar11);
      if (*pbVar11 == 0x5b) {
        sVar10 = sVar10 - 2;
        sVar12 = strspn((char *)(pbVar11 + 1),"0123456789abcdefABCDEF::.%");
      }
      else {
        sVar12 = strcspn((char *)pbVar11," ");
      }
      CVar8 = CURLUE_MALFORMED_INPUT;
      if (sVar10 != sVar12) goto LAB_003d00e8;
      pcVar13 = (*Curl_cstrdup)((char *)pbVar11);
      u->host = pcVar13;
      if (pcVar13 == (char *)0x0) goto LAB_003d00e5;
    }
    CVar8 = CURLUE_OUT_OF_MEMORY;
    if ((pbVar19 != (byte *)0x0) && (*pbVar19 != 0)) {
      pcVar13 = (*Curl_cstrdup)((char *)pbVar19);
      u->query = pcVar13;
      if (pcVar13 == (char *)0x0) goto LAB_003d00e5;
    }
    if ((pcVar17 != (char *)0x0) && (*pcVar17 != '\0')) {
      pcVar13 = (*Curl_cstrdup)(pcVar17);
      u->fragment = pcVar13;
      if (pcVar13 == (char *)0x0) goto LAB_003d00e8;
    }
    (*Curl_cfree)(u->scratch);
    u->scratch = (char *)0x0;
    return CURLUE_OK;
  }
  *pbVar11 = 0;
  if ((flags & 0x204) == 0) goto LAB_003d00e8;
  pcVar13 = (char *)0x0;
  local_64 = flags;
  if ((flags & 4) != 0) {
    pcVar13 = "https";
  }
LAB_003cfae3:
  CVar8 = CURLUE_MALFORMED_INPUT;
  pbVar19 = pbVar11 + sVar10 + 1;
  sVar10 = 0;
  while ((0x3f < (ulong)(byte)url[sVar10] ||
         ((0x8000800800000001U >> ((ulong)(byte)url[sVar10] & 0x3f) & 1) == 0))) {
    sVar10 = sVar10 + 1;
  }
  if (sVar10 == 0) goto LAB_003d00e8;
  memcpy(pbVar19,url,sVar10);
  pbVar19[sVar10] = 0;
  if (pcVar13 == (char *)0x0 && (local_64 >> 9 & 1) != 0) {
    iVar4 = curl_strnequal("ftp.",(char *)pbVar19,4);
    if (iVar4 == 0) {
      iVar4 = curl_strnequal("dict.",(char *)pbVar19,5);
      if (iVar4 == 0) {
        iVar4 = curl_strnequal("ldap.",(char *)pbVar19,5);
        if (iVar4 == 0) {
          iVar4 = curl_strnequal("imap.",(char *)pbVar19,5);
          if (iVar4 == 0) {
            iVar4 = curl_strnequal("smtp.",(char *)pbVar19,5);
            if (iVar4 == 0) {
              iVar4 = curl_strnequal("pop3.",(char *)pbVar19,5);
              pcVar13 = "pop3";
              if (iVar4 == 0) {
                pcVar13 = "http";
              }
            }
            else {
              pcVar13 = "smtp";
            }
          }
          else {
            pcVar13 = "imap";
          }
        }
        else {
          pcVar13 = "ldap";
        }
      }
      else {
        pcVar13 = "dict";
      }
    }
    else {
      pcVar13 = "ftp";
    }
  }
  sVar12 = strlen(url + sVar10);
  memcpy(pbVar11,url + sVar10,sVar12);
  pbVar11[sVar12] = 0;
  pcVar13 = (*Curl_cstrdup)(pcVar13);
  u->scheme = pcVar13;
  if (pcVar13 != (char *)0x0) goto LAB_003cfd8c;
LAB_003d00e5:
  CVar8 = CURLUE_OUT_OF_MEMORY;
LAB_003d00e8:
  free_urlhandle(u);
  u->fragment = (char *)0x0;
  u->scratch = (char *)0x0;
  u->path = (char *)0x0;
  u->query = (char *)0x0;
  u->host = (char *)0x0;
  u->port = (char *)0x0;
  u->password = (char *)0x0;
  u->options = (char *)0x0;
  u->scheme = (char *)0x0;
  u->user = (char *)0x0;
  u->portnum = 0;
  return CVar8;
}

Assistant:

static CURLUcode parseurl(const char *url, CURLU *u, unsigned int flags)
{
  CURLUcode result = seturl(url, u, flags);
  if(result) {
    free_urlhandle(u);
    memset(u, 0, sizeof(struct Curl_URL));
  }
  return result;
}